

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_a80684::OpCodeParser::OpCodeParser(OpCodeParser *this)

{
  long lVar1;
  undefined1 uVar2;
  size_type in_RDI;
  long in_FS_OFFSET;
  uint op;
  string strName;
  opcodetype in_stack_0000031c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  mapped_type *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  mapped_type in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff78;
  mapped_type mVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  mapped_type local_54;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
         *)in_stack_ffffffffffffff58);
  for (local_54 = OP_0; local_54 < OP_CHECKSIGADD; local_54 = local_54 + 1) {
    if ((OP_16 < local_54) || (local_54 == OP_RESERVED)) {
      GetOpName_abi_cxx11_(in_stack_0000031c);
      uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              (char *)in_stack_ffffffffffffff60);
      if ((bool)uVar2) {
        in_stack_ffffffffffffff98 = 4;
      }
      else {
        mVar3 = local_54;
        in_stack_ffffffffffffff80 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                           *)in_stack_ffffffffffffff80,
                          (key_type *)CONCAT44(local_54,in_stack_ffffffffffffff78));
        *(mapped_type *)&(in_stack_ffffffffffffff80->_M_dataplus)._M_p = mVar3;
        in_stack_ffffffffffffff78 =
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,in_stack_ffffffffffffff88),(size_type)in_stack_ffffffffffffff80,
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (char *)CONCAT44(mVar3,in_stack_ffffffffffffff78));
        if (in_stack_ffffffffffffff78 == 0) {
          in_stack_ffffffffffffff6c = local_54;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (in_stack_ffffffffffffff80,(ulong)mVar3 << 0x20,in_RDI);
          in_stack_ffffffffffffff60 =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                             *)in_stack_ffffffffffffff80,
                            (key_type *)CONCAT44(mVar3,in_stack_ffffffffffffff78));
          *in_stack_ffffffffffffff60 = in_stack_ffffffffffffff6c;
          std::__cxx11::string::~string(in_stack_ffffffffffffff58);
        }
        in_stack_ffffffffffffff98 = 0;
      }
      std::__cxx11::string::~string(in_stack_ffffffffffffff58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

OpCodeParser()
    {
        for (unsigned int op = 0; op <= MAX_OPCODE; ++op) {
            // Allow OP_RESERVED to get into mapOpNames
            if (op < OP_NOP && op != OP_RESERVED) {
                continue;
            }

            std::string strName = GetOpName(static_cast<opcodetype>(op));
            if (strName == "OP_UNKNOWN") {
                continue;
            }
            mapOpNames[strName] = static_cast<opcodetype>(op);
            // Convenience: OP_ADD and just ADD are both recognized:
            if (strName.compare(0, 3, "OP_") == 0) { // strName starts with "OP_"
                mapOpNames[strName.substr(3)] = static_cast<opcodetype>(op);
            }
        }
    }